

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::VarintTest_TestWriteU64CanBeReadWithReadU64_Test::
~VarintTest_TestWriteU64CanBeReadWithReadU64_Test
          (VarintTest_TestWriteU64CanBeReadWithReadU64_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VarintTest, TestWriteU64CanBeReadWithReadU64)
{
    ByteBuffer buffer0 = HexEncoderDecoder::WriteU64ToNewStream(0);
    ByteBuffer buffer1 = HexEncoderDecoder::WriteU64ToNewStream(1);
    ByteBuffer buffer2 = HexEncoderDecoder::WriteU64ToNewStream(2);
    ByteBuffer buffer3 = HexEncoderDecoder::WriteU64ToNewStream(3);
    ByteBuffer buffer17 = HexEncoderDecoder::WriteU64ToNewStream(17);
    ByteBuffer buffer127 = HexEncoderDecoder::WriteU64ToNewStream(127);
    ByteBuffer buffer128 = HexEncoderDecoder::WriteU64ToNewStream(128);
    ByteBuffer buffer1000 = HexEncoderDecoder::WriteU64ToNewStream(1000);
    ByteBuffer buffer10000 = HexEncoderDecoder::WriteU64ToNewStream(10000);
    ByteBuffer buffer872682762 = HexEncoderDecoder::WriteU64ToNewStream(872682762);
    ByteBuffer buffer2147483647 = HexEncoderDecoder::WriteU64ToNewStream(2147483647);
    ByteBuffer buffer10000000000000L = HexEncoderDecoder::WriteU64ToNewStream(10000000000000L);
    ByteBuffer buffer836286376726767676L = HexEncoderDecoder::WriteU64ToNewStream(836286376726767676L);
    ByteBuffer buffer_max = HexEncoderDecoder::WriteU64ToNewStream(UINT64_MAX);

    ASSERT_EQ(0, Varint::ReadU64(buffer0));
    ASSERT_EQ(1, Varint::ReadU64(buffer1));
    ASSERT_EQ(2, Varint::ReadU64(buffer2));
    ASSERT_EQ(3, Varint::ReadU64(buffer3));
    ASSERT_EQ(17, Varint::ReadU64(buffer17));
    ASSERT_EQ(127, Varint::ReadU64(buffer127));
    ASSERT_EQ(128, Varint::ReadU64(buffer128));
    ASSERT_EQ(1000, Varint::ReadU64(buffer1000));
    ASSERT_EQ(10000, Varint::ReadU64(buffer10000));
    ASSERT_EQ(872682762, Varint::ReadU64(buffer872682762));
    ASSERT_EQ(2147483647, Varint::ReadU64(buffer2147483647));
    ASSERT_EQ(10000000000000L, Varint::ReadU64(buffer10000000000000L));
    ASSERT_EQ(836286376726767676L, Varint::ReadU64(buffer836286376726767676L));
    ASSERT_EQ(UINT64_MAX, Varint::ReadU64(buffer_max));
}